

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O0

Value * __thiscall flow::IRBuilder::createSCmpEQ(IRBuilder *this,Value *lhs,Value *rhs,string *name)

{
  __type_conflict2 literal;
  LiteralType LVar1;
  LiteralType LVar2;
  ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
  *local_e0;
  ConstantString *local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
  *local_40;
  ConstantString *b;
  ConstantString *a;
  string *name_local;
  Value *rhs_local;
  Value *lhs_local;
  IRBuilder *this_local;
  
  a = (ConstantString *)name;
  name_local = (string *)rhs;
  rhs_local = lhs;
  lhs_local = (Value *)this;
  LVar1 = Value::type(lhs);
  LVar2 = Value::type((Value *)name_local);
  if (LVar1 != LVar2) {
    __assert_fail("lhs->type() == rhs->type()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                  ,0x193,
                  "Value *flow::IRBuilder::createSCmpEQ(Value *, Value *, const std::string &)");
  }
  LVar1 = Value::type(rhs_local);
  if (LVar1 == String) {
    if (rhs_local == (Value *)0x0) {
      local_d0 = (ConstantString *)0x0;
    }
    else {
      local_d0 = (ConstantString *)
                 __dynamic_cast(rhs_local,&Value::typeinfo,
                                &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,
                                0);
    }
    b = local_d0;
    if (local_d0 != (ConstantString *)0x0) {
      if (name_local == (string *)0x0) {
        local_e0 = (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
                    *)0x0;
      }
      else {
        local_e0 = (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
                    *)__dynamic_cast(name_local,&Value::typeinfo,
                                     &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::
                                      typeinfo,0);
      }
      local_40 = local_e0;
      if (local_e0 !=
          (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
           *)0x0) {
        ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
        ::get(&local_60,b);
        ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
        ::get(&local_80,local_40);
        literal = std::operator==(&local_60,&local_80);
        this_local = (IRBuilder *)getBoolean(this,literal);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
        return (Value *)this_local;
      }
    }
    makeName(&local_b0,this,(string *)a);
    this_local = (IRBuilder *)
                 insert<flow::BinaryInstr<(flow::BinaryOperator)22,(flow::LiteralType)1>,flow::Value*&,flow::Value*&,std::__cxx11::string>
                           (this,&rhs_local,(Value **)&name_local,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    return (Value *)this_local;
  }
  __assert_fail("lhs->type() == LiteralType::String",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                ,0x194,"Value *flow::IRBuilder::createSCmpEQ(Value *, Value *, const std::string &)"
               );
}

Assistant:

Value* IRBuilder::createSCmpEQ(Value* lhs, Value* rhs,
                               const std::string& name) {
  assert(lhs->type() == rhs->type());
  assert(lhs->type() == LiteralType::String);

  if (auto a = dynamic_cast<ConstantString*>(lhs))
    if (auto b = dynamic_cast<ConstantString*>(rhs))
      return getBoolean(a->get() == b->get());

  return insert<SCmpEQInstr>(lhs, rhs, makeName(name));
}